

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

bool __thiscall
Inline::InlConstFoldArg(Inline *this,Instr *instr,Instr **callerArgOuts,ArgSlot callerArgOutCount)

{
  StackSym *this_00;
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar3;
  Func *pFVar4;
  JITTimeFunctionBody *this_01;
  Opnd *this_02;
  RegOpnd *pRVar5;
  Instr *instr_00;
  Instr *instrDef;
  StackSym *sym;
  IntConstType value;
  Opnd *src1;
  Instr **ppIStack_28;
  ArgSlot callerArgOutCount_local;
  Instr **callerArgOuts_local;
  Instr *instr_local;
  Inline *this_local;
  
  src1._6_2_ = callerArgOutCount;
  ppIStack_28 = callerArgOuts;
  callerArgOuts_local = (Instr **)instr;
  instr_local = (Instr *)this;
  if (instr->m_opcode != ArgOut_A) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x1223,"(instr->m_opcode == Js::OpCode::ArgOut_A)",
                       "instr->m_opcode == Js::OpCode::ArgOut_A");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pFVar4 = Func::GetTopFunc((Func *)callerArgOuts_local[4]);
  sourceContextId = Func::GetSourceContextId(pFVar4);
  pFVar4 = Func::GetTopFunc((Func *)callerArgOuts_local[4]);
  functionId = Func::GetLocalFunctionId(pFVar4);
  bVar2 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01eafdf0,InlinerConstFoldPhase,sourceContextId,functionId);
  if (bVar2) {
    this_local._7_1_ = false;
  }
  else {
    this_01 = Func::GetJITFunctionBody((Func *)callerArgOuts_local[4]);
    bVar2 = JITTimeFunctionBody::HasTry(this_01);
    if (bVar2) {
      this_local._7_1_ = false;
    }
    else {
      value = (IntConstType)IR::Instr::GetSrc1((Instr *)callerArgOuts_local);
      bVar2 = IR::Opnd::IsRegOpnd((Opnd *)value);
      if (bVar2) {
        this_02 = IR::Instr::GetSrc1((Instr *)callerArgOuts_local);
        pRVar5 = IR::Opnd::AsRegOpnd(this_02);
        this_00 = pRVar5->m_sym;
        bVar2 = StackSym::IsSingleDef(this_00);
        if (bVar2) {
          instr_00 = StackSym::GetInstrDef(this_00);
          bVar2 = InlConstFold(this,instr_00,(IntConstType *)&sym,ppIStack_28,src1._6_2_);
          if (bVar2) {
            this_local._7_1_ = true;
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Inline::InlConstFoldArg(IR::Instr *instr, __in_ecount_opt(callerArgOutCount) IR::Instr *callerArgOuts[], Js::ArgSlot callerArgOutCount)
{
    Assert(instr->m_opcode == Js::OpCode::ArgOut_A);

    if (PHASE_OFF(Js::InlinerConstFoldPhase, instr->m_func->GetTopFunc()))
    {
        return false;
    }
    if (instr->m_func->GetJITFunctionBody()->HasTry())
    {
        return false;
    }

    IR::Opnd *src1 = instr->GetSrc1();
    IntConstType value;

    if (!src1->IsRegOpnd())
    {
        return false;
    }

    StackSym *sym = instr->GetSrc1()->AsRegOpnd()->m_sym;

    if (!sym->IsSingleDef())
    {
        return false;
    }

    IR::Instr *instrDef = sym->GetInstrDef();
    if (!this->InlConstFold(instrDef, &value, callerArgOuts, callerArgOutCount))
    {
        return false;
    }
    return true;
}